

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.h
# Opt level: O2

void __thiscall FResourceLump::FResourceLump(FResourceLump *this)

{
  this->_vptr_FResourceLump = (_func_int **)&PTR__FResourceLump_007e5f00;
  (this->FullName).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  this->Flags = '\0';
  this->RefCount = '\0';
  (this->field_3).Name[0] = '\0';
  this->Cache = (char *)0x0;
  this->Owner = (FResourceFile *)0x0;
  *(undefined8 *)((long)&this->Owner + 4) = 0;
  *(undefined8 *)((long)&this->LinkedTexture + 4) = 0;
  return;
}

Assistant:

FResourceLump()
	{
		Cache = NULL;
		Owner = NULL;
		Flags = 0;
		RefCount = 0;
		Namespace = 0;	// ns_global
		*Name = 0;
		LinkedTexture = NULL;
	}